

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verFormula.c
# Opt level: O0

int Ver_FormulaParserFindVar(char *pString,Vec_Ptr_t *vNames)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  char *__s2;
  bool bVar4;
  int local_3c;
  int i;
  int nLength2;
  int nLength;
  char *pTemp2;
  char *pTemp;
  Vec_Ptr_t *vNames_local;
  char *pString_local;
  
  pTemp2 = pString;
  if (*pString == '\\') {
    vNames_local = (Vec_Ptr_t *)(pString + 1);
    while( true ) {
      bVar4 = false;
      if (*pTemp2 != '\0') {
        bVar4 = *pTemp2 != ' ';
      }
      if (!bVar4) break;
      pTemp2 = pTemp2 + 1;
    }
  }
  else {
    while( true ) {
      bVar4 = false;
      if (((((*pTemp2 != '\0') && (bVar4 = false, *pTemp2 != ' ')) &&
           (bVar4 = false, *pTemp2 != '\t')) &&
          (((bVar4 = false, *pTemp2 != '\r' && (bVar4 = false, *pTemp2 != '\n')) &&
           ((bVar4 = false, *pTemp2 != ',' &&
            ((bVar4 = false, *pTemp2 != '}' && (bVar4 = false, *pTemp2 != '(')))))))) &&
         ((bVar4 = false, *pTemp2 != ')' &&
          (((((bVar4 = false, *pTemp2 != '!' && (bVar4 = false, *pTemp2 != '~')) &&
             (bVar4 = false, *pTemp2 != '&')) &&
            ((bVar4 = false, *pTemp2 != '|' && (bVar4 = false, *pTemp2 != '^')))) &&
           (bVar4 = false, *pTemp2 != '?')))))) {
        bVar4 = *pTemp2 != ':';
      }
      vNames_local = (Vec_Ptr_t *)pString;
      if (!bVar4) break;
      pTemp2 = pTemp2 + 1;
    }
  }
  iVar1 = (int)pTemp2 - (int)vNames_local;
  local_3c = 0;
  do {
    iVar2 = Vec_PtrSize(vNames);
    if (iVar2 / 2 <= local_3c) {
      Vec_PtrPush(vNames,(void *)(long)iVar1);
      Vec_PtrPush(vNames,vNames_local);
      return local_3c;
    }
    pvVar3 = Vec_PtrEntry(vNames,local_3c << 1);
    if ((int)pvVar3 == iVar1) {
      __s2 = (char *)Vec_PtrEntry(vNames,local_3c * 2 + 1);
      iVar2 = strncmp((char *)vNames_local,__s2,(long)iVar1);
      if (iVar2 == 0) {
        return local_3c;
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

int Ver_FormulaParserFindVar( char * pString, Vec_Ptr_t * vNames )
{
    char * pTemp, * pTemp2;
    int nLength, nLength2, i;
    // start the string
    pTemp = pString;
    // find the end of the string delimited by other characters
    if ( *pTemp == '\\' )
    {
        pString++;
        while ( *pTemp && *pTemp != ' ' )
            pTemp++;
    }
    else
    {
        while ( *pTemp && *pTemp != ' ' && *pTemp != '\t' && *pTemp != '\r' && *pTemp != '\n' && *pTemp != ',' && *pTemp != '}' && 
                *pTemp != VER_PARSE_SYM_OPEN && *pTemp != VER_PARSE_SYM_CLOSE && 
                *pTemp != VER_PARSE_SYM_NEGBEF1 && *pTemp != VER_PARSE_SYM_NEGBEF2 && 
                *pTemp != VER_PARSE_SYM_AND && *pTemp != VER_PARSE_SYM_OR && *pTemp != VER_PARSE_SYM_XOR && 
                *pTemp != VER_PARSE_SYM_MUX1 && *pTemp != VER_PARSE_SYM_MUX2 )
                pTemp++;
    }
    // look for this string in the array
    nLength = pTemp - pString;
    for ( i = 0; i < Vec_PtrSize(vNames)/2; i++ )
    {
        nLength2 = (int)(ABC_PTRUINT_T)Vec_PtrEntry( vNames, 2*i + 0 );
        if ( nLength2 != nLength )
            continue;
        pTemp2   = (char *)Vec_PtrEntry( vNames, 2*i + 1 );
        if ( strncmp( pString, pTemp2, nLength ) )
            continue;
        return i;
    }
    // could not find - add and return the number
    Vec_PtrPush( vNames, (void *)(ABC_PTRUINT_T)nLength );
    Vec_PtrPush( vNames, pString );
    return i;
}